

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O2

int __thiscall
gmath::OrthoCamera::clone
          (OrthoCamera *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  OrthoCamera *this_00;
  
  this_00 = (OrthoCamera *)operator_new(0xd0);
  OrthoCamera(this_00);
  operator=(this_00,this);
  return (int)this_00;
}

Assistant:

Camera *OrthoCamera::clone() const
{
  OrthoCamera *ret=new OrthoCamera();

  *ret=*this;

  return ret;
}